

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

string * __thiscall cli::Parser::usage_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  reference local_1d0;
  CmdBase **command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *__range2;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,(string *)&this->_general_help_text);
  std::operator<<(poVar2,"\n\n");
  std::operator<<(local_190,"Available parameters:\n\n");
  __end2 = std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::begin
                     (&this->_commands);
  command = (CmdBase **)
            std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::end
                      (&this->_commands);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                      (&__end2,(__normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                                *)&command);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1d0 = __gnu_cxx::
                __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                ::operator*(&__end2);
    poVar2 = std::operator<<(local_190,"  ");
    poVar2 = std::operator<<(poVar2,(string *)&(*local_1d0)->command);
    poVar2 = std::operator<<(poVar2,"\t");
    std::operator<<(poVar2,(string *)&(*local_1d0)->alternative);
    if (((*local_1d0)->required & 1U) == 1) {
      std::operator<<(local_190,"\t(required)");
    }
    poVar2 = std::operator<<(local_190,"\n   ");
    std::operator<<(poVar2,(string *)&(*local_1d0)->description);
    if (((*local_1d0)->required & 1U) == 0) {
      poVar2 = std::operator<<(local_190,"\n   ");
      (*(*local_1d0)->_vptr_CmdBase[2])(&local_210);
      std::operator+(&local_1f0,"This parameter is optional. The default value is \'",&local_210);
      poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
      std::operator<<(poVar2,"\'.");
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
    }
    std::operator<<(local_190,"\n\n");
    __gnu_cxx::
    __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string usage() const {
			std::stringstream ss { };
			ss << _general_help_text << "\n\n";
			ss << "Available parameters:\n\n";

			for (const auto& command : _commands) {
				ss << "  " << command->command << "\t" << command->alternative;

				if (command->required == true) {
					ss << "\t(required)";
				}

				ss << "\n   " << command->description;

				if (command->required == false) {
					ss << "\n   " << "This parameter is optional. The default value is '" + command->print_value() << "'.";
				}

				ss << "\n\n";
			}

			return ss.str();
		}